

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

void __thiscall gimage::anon_unknown_6::TiffImage<float>::~TiffImage(TiffImage<float> *this)

{
  TIFFClose(this->tif);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->row).super__Vector_base<float,_std::allocator<float>_>);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&this->rows);
  return;
}

Assistant:

~TiffImage()
    {
      TIFFClose(tif);
    }